

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::JoinMulticastGroup(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  RTPMemoryManager *pRVar3;
  HashElement *pHVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  HashElement *pHVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  in6_addr mcastIP;
  ipv6_mreq mreq;
  anon_union_16_3_a3f0114d_for___in6_u local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  uint local_18;
  
  if (this->init != true) {
    return -0x72;
  }
  if (this->created != true) {
    return -0x71;
  }
  if (addr->addresstype != IPv6Address) {
    return -0x6c;
  }
  uVar1 = *(undefined8 *)&addr->field_0xc;
  uVar2 = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
  if ((char)uVar1 != -1) {
    return -0x70;
  }
  local_38.__u6_addr32[3] = (uint32_t)((ulong)uVar2 >> 0x20);
  uVar8 = (local_38.__u6_addr32[3] >> 0x18 | (local_38.__u6_addr32[3] & 0xff0000) >> 8 |
           (local_38.__u6_addr32[3] & 0xff00) << 8 | local_38.__u6_addr32[3] << 0x18) % 0x207d;
  pHVar7 = (this->multicastgroups).table[uVar8];
  local_38._0_8_ = uVar1;
  local_38._8_8_ = uVar2;
  if (pHVar7 != (HashElement *)0x0) {
    bVar5 = false;
    local_38.__u6_addr8[1] = (uint8_t)((ulong)uVar1 >> 8);
    local_38.__u6_addr8[2] = (uint8_t)((ulong)uVar1 >> 0x10);
    local_38.__u6_addr8[3] = (uint8_t)((ulong)uVar1 >> 0x18);
    local_38.__u6_addr8[4] = (uint8_t)((ulong)uVar1 >> 0x20);
    local_38.__u6_addr8[5] = (uint8_t)((ulong)uVar1 >> 0x28);
    local_38.__u6_addr8[6] = (uint8_t)((ulong)uVar1 >> 0x30);
    local_38.__u6_addr8[7] = (uint8_t)((ulong)uVar1 >> 0x38);
    local_38.__u6_addr8[8] = (uint8_t)uVar2;
    local_38.__u6_addr8[9] = (uint8_t)((ulong)uVar2 >> 8);
    local_38.__u6_addr8[10] = (uint8_t)((ulong)uVar2 >> 0x10);
    local_38.__u6_addr8[0xb] = (uint8_t)((ulong)uVar2 >> 0x18);
    local_38.__u6_addr8[0xc] = (uint8_t)((ulong)uVar2 >> 0x20);
    local_38.__u6_addr8[0xd] = (uint8_t)((ulong)uVar2 >> 0x28);
    local_38.__u6_addr8[0xe] = (uint8_t)((ulong)uVar2 >> 0x30);
    local_38.__u6_addr8[0xf] = (uint8_t)((ulong)uVar2 >> 0x38);
    do {
      auVar9[0] = -((pHVar7->element).__in6_u.__u6_addr8[0] == 0xff);
      auVar9[1] = -((pHVar7->element).__in6_u.__u6_addr8[1] == local_38.__u6_addr8[1]);
      auVar9[2] = -((pHVar7->element).__in6_u.__u6_addr8[2] == local_38.__u6_addr8[2]);
      auVar9[3] = -((pHVar7->element).__in6_u.__u6_addr8[3] == local_38.__u6_addr8[3]);
      auVar9[4] = -((pHVar7->element).__in6_u.__u6_addr8[4] == local_38.__u6_addr8[4]);
      auVar9[5] = -((pHVar7->element).__in6_u.__u6_addr8[5] == local_38.__u6_addr8[5]);
      auVar9[6] = -((pHVar7->element).__in6_u.__u6_addr8[6] == local_38.__u6_addr8[6]);
      auVar9[7] = -((pHVar7->element).__in6_u.__u6_addr8[7] == local_38.__u6_addr8[7]);
      auVar9[8] = -((pHVar7->element).__in6_u.__u6_addr8[8] == local_38.__u6_addr8[8]);
      auVar9[9] = -((pHVar7->element).__in6_u.__u6_addr8[9] == local_38.__u6_addr8[9]);
      auVar9[10] = -((pHVar7->element).__in6_u.__u6_addr8[10] == local_38.__u6_addr8[10]);
      auVar9[0xb] = -((pHVar7->element).__in6_u.__u6_addr8[0xb] == local_38.__u6_addr8[0xb]);
      auVar9[0xc] = -((pHVar7->element).__in6_u.__u6_addr8[0xc] == local_38.__u6_addr8[0xc]);
      auVar9[0xd] = -((pHVar7->element).__in6_u.__u6_addr8[0xd] == local_38.__u6_addr8[0xd]);
      auVar9[0xe] = -((pHVar7->element).__in6_u.__u6_addr8[0xe] == local_38.__u6_addr8[0xe]);
      auVar9[0xf] = -((pHVar7->element).__in6_u.__u6_addr8[0xf] == local_38.__u6_addr8[0xf]);
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        bVar5 = true;
      }
      else {
        pHVar7 = pHVar7->hashnext;
      }
    } while ((!bVar5) && (pHVar7 != (HashElement *)0x0));
    if (bVar5) {
      iVar6 = -4;
      bVar5 = false;
      goto LAB_0012636a;
    }
  }
  pRVar3 = (this->multicastgroups).super_RTPMemoryObject.mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    pHVar7 = (HashElement *)operator_new(0x38);
  }
  else {
    iVar6 = (*pRVar3->_vptr_RTPMemoryManager[2])
                      (pRVar3,0x38,(ulong)(uint)(this->multicastgroups).memorytype);
    pHVar7 = (HashElement *)CONCAT44(extraout_var,iVar6);
  }
  *(undefined8 *)&(pHVar7->element).__in6_u = local_38._0_8_;
  *(undefined8 *)((long)&(pHVar7->element).__in6_u + 8) = local_38._8_8_;
  pHVar7->hashprev = (HashElement *)0x0;
  pHVar7->hashnext = (HashElement *)0x0;
  pHVar7->listprev = (HashElement *)0x0;
  pHVar7->listnext = (HashElement *)0x0;
  pHVar7->hashindex = uVar8;
  pHVar4 = (this->multicastgroups).table[uVar8];
  (this->multicastgroups).table[uVar8] = pHVar7;
  pHVar7->hashnext = pHVar4;
  if (pHVar4 != (HashElement *)0x0) {
    pHVar4->hashprev = pHVar7;
  }
  if ((this->multicastgroups).firsthashelem == (HashElement *)0x0) {
    (this->multicastgroups).firsthashelem = pHVar7;
  }
  else {
    pHVar4 = (this->multicastgroups).lasthashelem;
    pHVar4->listnext = pHVar7;
    pHVar7->listprev = pHVar4;
  }
  (this->multicastgroups).lasthashelem = pHVar7;
  iVar6 = 0;
  bVar5 = true;
LAB_0012636a:
  if (bVar5) {
    local_28 = local_38._0_8_;
    uStack_20 = local_38._8_8_;
    local_18 = this->mcastifidx;
    iVar6 = setsockopt(this->rtpsock,0x29,0x14,&local_28,0x14);
    if (iVar6 == 0) {
      local_28 = local_38._0_8_;
      uStack_20 = local_38._8_8_;
      local_18 = this->mcastifidx;
      iVar6 = setsockopt(this->rtcpsock,0x29,0x14,&local_28,0x14);
      if (iVar6 == 0) {
        return 0;
      }
      local_28 = local_38._0_8_;
      uStack_20 = local_38._8_8_;
      local_18 = this->mcastifidx;
      setsockopt(this->rtpsock,0x29,0x15,&local_28,0x14);
    }
    RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::DeleteElement
              (&this->multicastgroups,(in6_addr *)&local_38);
    iVar6 = -0x69;
  }
  return iVar6;
}

Assistant:

int RTPUDPv6Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	in6_addr mcastIP = address.GetIP();
	
	if (!RTPUDPV6TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}